

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

bool __thiscall reflection::Service::Verify(Service *this,Verifier *verifier)

{
  bool bVar1;
  String *pSVar2;
  Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *pVVar3;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar4;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar5;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    pSVar2 = name(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6), bVar1
       )) {
      pVVar3 = calls(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::
              VerifyVector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>(verifier,pVVar3);
      if (bVar1) {
        pVVar3 = calls(this);
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::RPCCall>
                          (verifier,pVVar3);
        if ((bVar1) &&
           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8),
           bVar1)) {
          pVVar4 = attributes(this);
          bVar1 = flatbuffers::VerifierTemplate<false>::
                  VerifyVector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>
                            (verifier,pVVar4);
          if (bVar1) {
            pVVar4 = attributes(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                              (verifier,pVVar4);
            if ((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,10), bVar1)) {
              pVVar5 = documentation(this);
              bVar1 = flatbuffers::VerifierTemplate<false>::
                      VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                                (verifier,pVVar5);
              if (bVar1) {
                pVVar5 = documentation(this);
                bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,pVVar5)
                ;
                if ((bVar1) &&
                   (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                      (&this->super_Table,verifier,0xc), bVar1)) {
                  pSVar2 = declaration_file(this);
                  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
                  if (bVar1) {
                    verifier->depth_ = verifier->depth_ - 1;
                    return true;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffset(verifier, VT_CALLS) &&
           verifier.VerifyVector(calls()) &&
           verifier.VerifyVectorOfTables(calls()) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_DECLARATION_FILE) &&
           verifier.VerifyString(declaration_file()) &&
           verifier.EndTable();
  }